

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O3

Pixmap __thiscall
Am_Image_Array_Data::Safe_Get_X_Pixmap(Am_Image_Array_Data *this,Am_Drawonable_Impl *draw)

{
  Display *pDVar1;
  char *pcVar2;
  Pixmap PVar3;
  XColor *pXVar4;
  bool bVar5;
  int iVar6;
  Am_Generic_Image *pAVar7;
  Bitmap_Item *pBVar8;
  ostream *poVar9;
  int n_cols;
  Pixmap local_48;
  XColor *cols;
  uint h;
  uint w;
  
  pDVar1 = draw->screen->display;
  if (pDVar1 == this->main_display) {
    return this->main_bitmap;
  }
  for (pBVar8 = this->head; pBVar8 != (Bitmap_Item *)0x0; pBVar8 = pBVar8->next) {
    if (pBVar8->display == pDVar1) {
      return pBVar8->bitmap;
    }
  }
  cols = (XColor *)0x0;
  n_cols = 0;
  pcVar2 = this->name;
  if (pcVar2 != (char *)0x0) {
    bVar5 = is_gif(this);
    if (bVar5) {
      bVar5 = make_generic_image_from_name(this);
      if (!bVar5) {
        return 0;
      }
      local_48 = Make_Pixmap_From_Generic_Image(this,draw,&cols,&n_cols);
    }
    else {
      iVar6 = XReadBitmapFile(pDVar1,draw->xlib_drawable,pcVar2,&w,&h,&local_48,&this->x_hot,
                              &this->y_hot);
      pAVar7 = (Am_Generic_Image *)operator_new(0x20);
      (pAVar7->iminfo).width = (unsigned_short)w;
      (pAVar7->iminfo).height = (unsigned_short)h;
      (pAVar7->iminfo).depth = 1;
      (pAVar7->iminfo).num_colors = 0;
      (pAVar7->iminfo).transparent = false;
      *(undefined8 *)&(pAVar7->iminfo).raw_transparent_color_index = 0;
      *(undefined8 *)((long)&pAVar7->color_map + 6) = 0;
      *(undefined2 *)((long)&pAVar7->imdata + 6) = 0;
      this->image_ = pAVar7;
      if (iVar6 != 0) {
        return 0;
      }
    }
LAB_00277cba:
    pXVar4 = cols;
    PVar3 = local_48;
    iVar6 = n_cols;
    if (this->main_display == (Display *)0x0) {
      this->main_display = pDVar1;
      this->main_bitmap = local_48;
      this->colors = cols;
      this->num_colors = n_cols;
    }
    else {
      pBVar8 = (Bitmap_Item *)operator_new(0x38);
      pBVar8->display = pDVar1;
      pBVar8->bitmap = PVar3;
      pBVar8->mask = 0;
      pBVar8->inverted_mask = 0;
      pBVar8->colors = pXVar4;
      pBVar8->num_colors = iVar6;
      pBVar8->next = this->head;
      this->head = pBVar8;
    }
    return PVar3;
  }
  pAVar7 = this->image_;
  local_48 = XCreateBitmapFromData
                       (pDVar1,draw->xlib_drawable,pAVar7->imdata,(pAVar7->iminfo).width,
                        (pAVar7->iminfo).height);
  if (local_48 == 9) {
    pcVar2 = "** Bitmap Error: Bad Drawable error";
  }
  else {
    if (local_48 != 0xb) goto LAB_00277cba;
    pcVar2 = "** Bitmap Error: Bad Alloc error";
  }
  poVar9 = std::operator<<((ostream *)&std::cerr,pcVar2 + 0x11);
  std::endl<char,std::char_traits<char>>(poVar9);
  Am_Error();
}

Assistant:

Pixmap
Am_Image_Array_Data::Safe_Get_X_Pixmap(const Am_Drawonable_Impl *draw)
{
  Display *disp = draw->screen->display;
  if (disp == main_display)
    return main_bitmap;

  Pixmap bitmap;

  if (Get_Bitmap(disp, bitmap))
    return bitmap;

  XColor *cols = nullptr;
  int n_cols = 0;

  /* then we need to read it in or make it */
  if (name) {
    unsigned int w, h;

    /* read image rom a file */

    if (is_gif()) {
      if (!make_generic_image_from_name())
        return 0;
      bitmap = Make_Pixmap_From_Generic_Image(draw, cols, n_cols);
    } else { // it's an xbm
      int tmp = XReadBitmapFile(disp, draw->xlib_drawable, name, &w, &h,
                                &bitmap, &x_hot, &y_hot);
      // fill an empty structure to store width, height in.
      image_ = new Am_Generic_Image(nullptr, w, h, 1);
      if (tmp != BitmapSuccess)
        return 0;
    } // else bmp format
  } else {
    // then we need to make it from data
    // Assume that it's in XYBitmap format in the generic image item.
    unsigned short int width, height;
    image_->Get_Size(width, height);
    bitmap = XCreateBitmapFromData(disp, draw->xlib_drawable,
                                   (char *)image_->Get_Data(), width, height);

    if (bitmap == BadAlloc) {
      std::cerr << "Bad Alloc error" << std::endl;
      Am_Error();
    }
    if (bitmap == BadDrawable) {
      std::cerr << "Bad Drawable error" << std::endl;
      Am_Error();
    }
  }

  if (main_display)
    Add_Bitmap(disp, bitmap, cols, n_cols);
  else {
    main_display = disp;
    main_bitmap = bitmap;
    colors = cols;
    num_colors = n_cols;
  }
  return bitmap;
}